

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

uint * cimg_library::cimg::exception_mode(uint value,bool is_set)

{
  uint local_14;
  bool is_set_local;
  uint value_local;
  
  if (is_set) {
    mutex(0,1);
    local_14 = value;
    if (3 < value) {
      local_14 = 4;
    }
    exception_mode::mode = local_14;
    mutex(0,0);
  }
  return &exception_mode::mode;
}

Assistant:

inline unsigned int& exception_mode(const unsigned int value, const bool is_set) {
      static unsigned int mode = cimg_verbosity;
      if (is_set) { cimg::mutex(0); mode = value<4?value:4; cimg::mutex(0,0); }
      return mode;
    }